

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O0

void __thiscall ctemplate::TemplateDictionary::Dump(TemplateDictionary *this,int indent)

{
  void *__ptr;
  size_t __n;
  string local_38 [8];
  string out;
  int indent_local;
  TemplateDictionary *this_local;
  
  std::__cxx11::string::string(local_38);
  (*(this->super_TemplateDictionaryInterface)._vptr_TemplateDictionaryInterface[4])
            (this,local_38,(ulong)(uint)indent);
  __ptr = (void *)std::__cxx11::string::data();
  __n = std::__cxx11::string::length();
  fwrite(__ptr,1,__n,_stdout);
  fflush(_stdout);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void TemplateDictionary::Dump(int indent) const {
  string out;
  DumpToString(&out, indent);
  fwrite(out.data(), 1, out.length(), stdout);
  fflush(stdout);
}